

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O3

int av1_txfm_search(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,RD_STATS *rd_stats,
                   RD_STATS *rd_stats_y,RD_STATS *rd_stats_uv,int mode_rate,int64_t ref_best_rd)

{
  int iVar1;
  int iVar2;
  MB_MODE_INFO *pMVar3;
  MB_MODE_INFO *pMVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int64_t ref_best_rd_00;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  
  pMVar3 = (x->e_mbd).left_mbmi;
  pMVar4 = (x->e_mbd).above_mbmi;
  if (pMVar4 == (MB_MODE_INFO *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = (uint)pMVar4->skip_txfm;
  }
  if (pMVar3 == (MB_MODE_INFO *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = (uint)pMVar3->skip_txfm;
  }
  iVar1 = (x->mode_costs).skip_txfm_cost[uVar10 + uVar7][0];
  iVar2 = (x->mode_costs).skip_txfm_cost[uVar10 + uVar7][1];
  iVar13 = iVar2;
  if (iVar1 < iVar2) {
    iVar13 = iVar1;
  }
  if (ref_best_rd < (long)(iVar13 + mode_rate) * (long)x->rdmult + 0x100 >> 9) {
    rd_stats_y->rate = 0x7fffffff;
    rd_stats_y->zero_rate = 0;
    rd_stats_y->dist = 0x7fffffffffffffff;
    rd_stats_y->rdcost = 0x7fffffffffffffff;
    rd_stats_y->sse = 0x7fffffffffffffff;
    rd_stats_y->skip_txfm = '\0';
    return 0;
  }
  pMVar3 = *(x->e_mbd).mi;
  ref_best_rd_00 = ref_best_rd - ((long)x->rdmult * (long)mode_rate + 0x100 >> 9);
  if (ref_best_rd == 0x7fffffffffffffff) {
    ref_best_rd_00 = 0x7fffffffffffffff;
  }
  rd_stats->sse = 0;
  rd_stats->dist = 0;
  rd_stats->rdcost = 0;
  rd_stats->skip_txfm = '\x01';
  rd_stats->zero_rate = 0;
  rd_stats_y->rate = 0;
  rd_stats_y->zero_rate = 0;
  rd_stats_y->dist = 0;
  rd_stats_y->rdcost = 0;
  rd_stats_y->sse = 0;
  rd_stats_y->skip_txfm = '\x01';
  rd_stats->rate = mode_rate;
  av1_subtract_plane(x,bsize,0);
  if (((x->txfm_search_params).tx_mode_search_type == '\x02') &&
     ((x->e_mbd).lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0)) {
    av1_pick_recursive_tx_size_type_yrd(cpi,x,rd_stats_y,bsize,ref_best_rd_00);
  }
  else {
    av1_pick_uniform_tx_size_type_yrd(cpi,x,rd_stats_y,bsize,ref_best_rd_00);
    auVar16 = ZEXT216(CONCAT11(pMVar3->tx_size,pMVar3->tx_size));
    auVar16 = pshuflw(auVar16,auVar16,0);
    uVar15 = auVar16._0_4_;
    *(undefined4 *)pMVar3->inter_tx_size = uVar15;
    *(undefined4 *)(pMVar3->inter_tx_size + 4) = uVar15;
    *(undefined4 *)(pMVar3->inter_tx_size + 8) = uVar15;
    *(undefined4 *)(pMVar3->inter_tx_size + 0xc) = uVar15;
    uVar7 = (uint)(x->e_mbd).width * (uint)(x->e_mbd).height;
    if (uVar7 != 0) {
      uVar11 = 0;
      do {
        (x->txfm_search_info).blk_skip[uVar11] =
             (x->txfm_search_info).blk_skip[uVar11] & 0xfe | rd_stats_y->skip_txfm != '\0';
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
    }
  }
  if ((long)rd_stats_y->rate == 0x7fffffff) {
    return 0;
  }
  if ((long)rd_stats->rate == 0x7fffffff) {
    rd_stats->dist = 0x7fffffffffffffff;
    rd_stats->rdcost = 0x7fffffffffffffff;
    rd_stats->sse = 0x7fffffffffffffff;
    rd_stats->skip_txfm = '\0';
    rd_stats->zero_rate = 0;
    iVar13 = 0x7fffffff;
    lVar12 = -0x80;
    lVar14 = -0x80;
  }
  else {
    lVar9 = (long)rd_stats->rate + (long)rd_stats_y->rate;
    if (0x7ffffffe < lVar9) {
      lVar9 = 0x7fffffff;
    }
    iVar13 = (int)lVar9;
    rd_stats->rate = iVar13;
    if (rd_stats->zero_rate == 0) {
      rd_stats->zero_rate = rd_stats_y->zero_rate;
    }
    lVar14 = rd_stats->dist + rd_stats_y->dist;
    lVar9 = rd_stats->sse;
    rd_stats->dist = lVar14;
    lVar12 = 0x7fffffffffffffff;
    if ((lVar9 != 0x7fffffffffffffff) && (lVar12 = lVar9, rd_stats_y->sse != 0x7fffffffffffffff)) {
      lVar12 = rd_stats_y->sse + lVar9;
      rd_stats->sse = lVar12;
    }
    rd_stats->skip_txfm = rd_stats->skip_txfm & rd_stats_y->skip_txfm;
    lVar14 = lVar14 * 0x80;
    lVar12 = lVar12 << 7;
  }
  lVar14 = ((long)(iVar13 + iVar1) * (long)x->rdmult + 0x100 >> 9) + lVar14;
  iVar13 = mode_rate + iVar2;
  lVar12 = ((long)x->rdmult * (long)iVar13 + 0x100 >> 9) + lVar12;
  if (lVar14 < lVar12) {
    lVar12 = lVar14;
  }
  if (ref_best_rd < lVar12) {
    return 0;
  }
  rd_stats_uv->rate = 0;
  rd_stats_uv->zero_rate = 0;
  rd_stats_uv->dist = 0;
  rd_stats_uv->rdcost = 0;
  rd_stats_uv->sse = 0;
  rd_stats_uv->skip_txfm = '\x01';
  if (((cpi->common).seq_params)->monochrome == '\0') {
    if ((cpi->sf).inter_sf.perform_best_rd_based_gating_for_chroma == 0) {
      lVar12 = 0;
    }
    if (ref_best_rd == 0x7fffffffffffffff) {
      lVar12 = 0;
    }
    iVar8 = av1_txfm_uvrd(cpi,x,rd_stats_uv,bsize,ref_best_rd - lVar12);
    if (iVar8 == 0) {
      return 0;
    }
    if (((long)rd_stats->rate != 0x7fffffff) && ((long)rd_stats_uv->rate != 0x7fffffff)) {
      lVar9 = (long)rd_stats_uv->rate + (long)rd_stats->rate;
      if (0x7ffffffe < lVar9) {
        lVar9 = 0x7fffffff;
      }
      rd_stats->rate = (int)lVar9;
      if (rd_stats->zero_rate == 0) {
        rd_stats->zero_rate = rd_stats_uv->zero_rate;
      }
      rd_stats->dist = rd_stats->dist + rd_stats_uv->dist;
      if ((rd_stats->sse != 0x7fffffffffffffff) && (rd_stats_uv->sse != 0x7fffffffffffffff)) {
        rd_stats->sse = rd_stats_uv->sse + rd_stats->sse;
      }
      bVar6 = rd_stats->skip_txfm & rd_stats_uv->skip_txfm;
      rd_stats->skip_txfm = bVar6;
      goto LAB_0023b7d5;
    }
    rd_stats->rate = 0x7fffffff;
    rd_stats->zero_rate = 0;
    rd_stats->dist = 0x7fffffffffffffff;
    rd_stats->rdcost = 0x7fffffffffffffff;
    rd_stats->sse = 0x7fffffffffffffff;
    rd_stats->skip_txfm = '\0';
LAB_0023b8ce:
    if ((x->e_mbd).lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0) {
      lVar9 = rd_stats->sse;
      bVar5 = true;
      if (lVar9 * 0x80 + ((long)iVar2 * (long)x->rdmult + 0x100 >> 9) <=
          rd_stats->dist * 0x80 +
          ((long)(rd_stats_y->rate + iVar1 + rd_stats_uv->rate) * (long)x->rdmult + 0x100 >> 9))
      goto LAB_0023b7e3;
    }
    rd_stats->rate = rd_stats->rate + iVar1;
    pMVar3->skip_txfm = '\0';
  }
  else {
    bVar6 = rd_stats->skip_txfm;
LAB_0023b7d5:
    if (bVar6 == 0) goto LAB_0023b8ce;
    lVar9 = rd_stats->sse;
    bVar5 = false;
LAB_0023b7e3:
    rd_stats_y->rate = 0;
    rd_stats_uv->rate = 0;
    rd_stats->rate = iVar13;
    rd_stats->dist = lVar9;
    rd_stats_y->dist = rd_stats_y->sse;
    rd_stats_uv->dist = rd_stats_uv->sse;
    pMVar3->skip_txfm = '\x01';
    if ((!bVar5) &&
       (ref_best_rd < rd_stats->dist * 0x80 + ((long)x->rdmult * (long)iVar13 + 0x100 >> 9))) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int av1_txfm_search(const AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize,
                    RD_STATS *rd_stats, RD_STATS *rd_stats_y,
                    RD_STATS *rd_stats_uv, int mode_rate, int64_t ref_best_rd) {
  MACROBLOCKD *const xd = &x->e_mbd;
  TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const int skip_ctx = av1_get_skip_txfm_context(xd);
  const int skip_txfm_cost[2] = { x->mode_costs.skip_txfm_cost[skip_ctx][0],
                                  x->mode_costs.skip_txfm_cost[skip_ctx][1] };
  const int64_t min_header_rate =
      mode_rate + AOMMIN(skip_txfm_cost[0], skip_txfm_cost[1]);
  // Account for minimum skip and non_skip rd.
  // Eventually either one of them will be added to mode_rate
  const int64_t min_header_rd_possible = RDCOST(x->rdmult, min_header_rate, 0);
  if (min_header_rd_possible > ref_best_rd) {
    av1_invalid_rd_stats(rd_stats_y);
    return 0;
  }

  const AV1_COMMON *cm = &cpi->common;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int64_t mode_rd = RDCOST(x->rdmult, mode_rate, 0);
  const int64_t rd_thresh =
      ref_best_rd == INT64_MAX ? INT64_MAX : ref_best_rd - mode_rd;
  av1_init_rd_stats(rd_stats);
  av1_init_rd_stats(rd_stats_y);
  rd_stats->rate = mode_rate;

  // cost and distortion
  av1_subtract_plane(x, bsize, 0);
  if (txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
      !xd->lossless[mbmi->segment_id]) {
    av1_pick_recursive_tx_size_type_yrd(cpi, x, rd_stats_y, bsize, rd_thresh);
#if CONFIG_COLLECT_RD_STATS == 2
    PrintPredictionUnitStats(cpi, tile_data, x, rd_stats_y, bsize);
#endif  // CONFIG_COLLECT_RD_STATS == 2
  } else {
    av1_pick_uniform_tx_size_type_yrd(cpi, x, rd_stats_y, bsize, rd_thresh);
    memset(mbmi->inter_tx_size, mbmi->tx_size, sizeof(mbmi->inter_tx_size));
    for (int i = 0; i < xd->height * xd->width; ++i)
      set_blk_skip(x->txfm_search_info.blk_skip, 0, i, rd_stats_y->skip_txfm);
  }

  if (rd_stats_y->rate == INT_MAX) return 0;

  av1_merge_rd_stats(rd_stats, rd_stats_y);

  const int64_t non_skip_txfm_rdcosty =
      RDCOST(x->rdmult, rd_stats->rate + skip_txfm_cost[0], rd_stats->dist);
  const int64_t skip_txfm_rdcosty =
      RDCOST(x->rdmult, mode_rate + skip_txfm_cost[1], rd_stats->sse);
  const int64_t min_rdcosty = AOMMIN(non_skip_txfm_rdcosty, skip_txfm_rdcosty);
  if (min_rdcosty > ref_best_rd) return 0;

  av1_init_rd_stats(rd_stats_uv);
  const int num_planes = av1_num_planes(cm);
  if (num_planes > 1) {
    int64_t ref_best_chroma_rd = ref_best_rd;
    // Calculate best rd cost possible for chroma
    if (cpi->sf.inter_sf.perform_best_rd_based_gating_for_chroma &&
        (ref_best_chroma_rd != INT64_MAX)) {
      ref_best_chroma_rd = (ref_best_chroma_rd -
                            AOMMIN(non_skip_txfm_rdcosty, skip_txfm_rdcosty));
    }
    const int is_cost_valid_uv =
        av1_txfm_uvrd(cpi, x, rd_stats_uv, bsize, ref_best_chroma_rd);
    if (!is_cost_valid_uv) return 0;
    av1_merge_rd_stats(rd_stats, rd_stats_uv);
  }

  int choose_skip_txfm = rd_stats->skip_txfm;
  if (!choose_skip_txfm && !xd->lossless[mbmi->segment_id]) {
    const int64_t rdcost_no_skip_txfm = RDCOST(
        x->rdmult, rd_stats_y->rate + rd_stats_uv->rate + skip_txfm_cost[0],
        rd_stats->dist);
    const int64_t rdcost_skip_txfm =
        RDCOST(x->rdmult, skip_txfm_cost[1], rd_stats->sse);
    if (rdcost_no_skip_txfm >= rdcost_skip_txfm) choose_skip_txfm = 1;
  }
  if (choose_skip_txfm) {
    rd_stats_y->rate = 0;
    rd_stats_uv->rate = 0;
    rd_stats->rate = mode_rate + skip_txfm_cost[1];
    rd_stats->dist = rd_stats->sse;
    rd_stats_y->dist = rd_stats_y->sse;
    rd_stats_uv->dist = rd_stats_uv->sse;
    mbmi->skip_txfm = 1;
    if (rd_stats->skip_txfm) {
      const int64_t tmprd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
      if (tmprd > ref_best_rd) return 0;
    }
  } else {
    rd_stats->rate += skip_txfm_cost[0];
    mbmi->skip_txfm = 0;
  }

  return 1;
}